

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusplatformmenu_p.cpp
# Opt level: O0

void QDBusPlatformMenu::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QMetaType QVar2;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QDBusPlatformMenu *_t;
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QMetaType local_48;
  QMetaType local_40 [7];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      updated((QDBusPlatformMenu *)0xb1942e,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    }
    else if (in_EDX == 1) {
      QList<QDBusMenuItem>::QList
                ((QList<QDBusMenuItem> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (QList<QDBusMenuItem> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QList<QDBusMenuItemKeys>::QList
                ((QList<QDBusMenuItemKeys> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (QList<QDBusMenuItemKeys> *)
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      propertiesUpdated((QDBusPlatformMenu *)
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (QDBusMenuItemList *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                        (QDBusMenuItemKeysList *)0xb19483);
      QList<QDBusMenuItemKeys>::~QList((QList<QDBusMenuItemKeys> *)0xb19490);
      QList<QDBusMenuItem>::~QList((QList<QDBusMenuItem> *)0xb1949d);
    }
    else if (in_EDX == 2) {
      popupRequested((QDBusPlatformMenu *)0xb194bf,in_stack_ffffffffffffff3c,
                     in_stack_ffffffffffffff38);
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 1) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar2 = QMetaType::fromType<QList<QDBusMenuItem>>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else if (**(int **)(in_RCX + 8) == 1) {
        QVar2 = QMetaType::fromType<QList<QDBusMenuItemKeys>>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&local_48,0,8);
        QMetaType::QMetaType(&local_48);
        **(undefined8 **)in_RCX = local_48.d_ptr;
      }
    }
    else {
      memset(local_40,0,8);
      QMetaType::QMetaType(local_40);
      **(undefined8 **)in_RCX = local_40[0].d_ptr;
    }
  }
  if (((in_ESI == 5) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QDBusPlatformMenu::*)(unsigned_int,int)>
                         (in_RCX,(void **)updated,0,0), !bVar1)) &&
     (bVar1 = QtMocHelpers::
              indexOfMethod<void(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,QList<QDBusMenuItemKeys>)>
                        (in_RCX,(void **)propertiesUpdated,0,1), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QDBusPlatformMenu::*)(int,unsigned_int)>
              (in_RCX,(void **)popupRequested,0,2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusPlatformMenu::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusPlatformMenu *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updated((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->propertiesUpdated((*reinterpret_cast< std::add_pointer_t<QDBusMenuItemList>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuItemKeysList>>(_a[2]))); break;
        case 2: _t->popupRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemKeysList >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemList >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(uint , int )>(_a, &QDBusPlatformMenu::updated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(QDBusMenuItemList , QDBusMenuItemKeysList )>(_a, &QDBusPlatformMenu::propertiesUpdated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(int , uint )>(_a, &QDBusPlatformMenu::popupRequested, 2))
            return;
    }
}